

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

uint32 __thiscall google::anon_unknown_8::LogFileObject::LogSize(LogFileObject *this)

{
  uint32 uVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  LogFileObject *this_local;
  
  l._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex_);
  uVar1 = this->file_length_;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return uVar1;
}

Assistant:

uint32 LogSize() override {
    std::lock_guard<std::mutex> l{mutex_};
    return file_length_;
  }